

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<sdf_tools::Grid> * __thiscall
pybind11::class_<sdf_tools::Grid>::def<sdf_tools::exportGrid(pybind11::module_&)::__2>
          (class_<sdf_tools::Grid> *this,char *name_,type *f)

{
  type *this_00;
  type *in_RDX;
  none *in_RSI;
  handle *in_RDI;
  cpp_function *in_stack_00000030;
  char *in_stack_00000038;
  object *in_stack_00000040;
  cpp_function cf;
  handle *in_stack_ffffffffffffff78;
  is_method *in_stack_ffffffffffffff98;
  handle in_stack_ffffffffffffffa0;
  handle in_stack_ffffffffffffffa8;
  handle this_01;
  is_method local_30;
  name local_28 [3];
  none *local_10;
  
  local_10 = in_RSI;
  this_00 = method_adaptor<sdf_tools::Grid,sdf_tools::exportGrid(pybind11::module_&)::__2>(in_RDX);
  pybind11::name::name(local_28,(char *)local_10);
  is_method::is_method(&local_30,in_RDI);
  none::none(local_10);
  this_01.m_ptr = in_stack_ffffffffffffffa8.m_ptr;
  getattr(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  sibling::sibling((sibling *)this_00,in_stack_ffffffffffffff78);
  cpp_function::
  cpp_function<sdf_tools::exportGrid(pybind11::module_&)::__2,pybind11::name,pybind11::is_method,pybind11::sibling,void>
            ((cpp_function *)this_01.m_ptr,(type *)in_stack_ffffffffffffffa8.m_ptr,
             (name *)in_stack_ffffffffffffffa0.m_ptr,in_stack_ffffffffffffff98,(sibling *)local_10);
  object::~object((object *)0x160984);
  none::~none((none *)0x16098e);
  detail::add_class_method(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  cpp_function::~cpp_function((cpp_function *)0x1609ae);
  return (class_<sdf_tools::Grid> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }